

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O0

natwm_error workspace_remove_client(natwm_state *state,workspace *workspace,client *client)

{
  node *node;
  node *client_node;
  client *client_local;
  workspace *workspace_local;
  natwm_state *state_local;
  
  node = get_client_node_from_client(workspace->clients,client);
  if (node == (node *)0x0) {
    state_local._4_4_ = NOT_FOUND_ERROR;
  }
  else {
    list_remove(workspace->clients,node);
    node_destroy(node);
    map_delete(state->workspace_list->client_map,client);
    if (workspace->active_client == client) {
      workspace->active_client = (client *)0x0;
      workspace_reset_focus(state,workspace);
    }
    state_local._4_4_ = NO_ERROR;
  }
  return state_local._4_4_;
}

Assistant:

enum natwm_error workspace_remove_client(struct natwm_state *state, struct workspace *workspace,
                                         struct client *client)
{
        struct node *client_node = get_client_node_from_client(workspace->clients, client);

        if (client_node == NULL) {
                return NOT_FOUND_ERROR;
        }

        list_remove(workspace->clients, client_node);

        node_destroy(client_node);

        map_delete(state->workspace_list->client_map, &client->window);

        if (workspace->active_client == client) {
                workspace->active_client = NULL;

                workspace_reset_focus(state, workspace);
        }

        return NO_ERROR;
}